

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_div_s_w_mips64el(CPUMIPSState_conflict10 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  float32 fVar1;
  float32 fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float32 fVar6;
  int iVar7;
  
  fVar1 = (env->active_fpu).fpr[ws].fs[0];
  fVar2 = (env->active_fpu).fpr[wt].fs[0];
  iVar4 = -0x80000000;
  fVar6 = 0x80000000;
  if (fVar2 != 0xffffffff || fVar1 != 0x80000000) {
    if (fVar2 == 0) {
      fVar6 = (uint)((int)fVar1 < 0) * 2 - 1;
    }
    else {
      fVar6 = (int)fVar1 / (int)fVar2;
    }
  }
  (env->active_fpu).fpr[wd].fs[0] = fVar6;
  iVar3 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  iVar5 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  if (iVar5 != -1 || iVar3 != -0x80000000) {
    if (iVar5 == 0) {
      iVar4 = (uint)(iVar3 < 0) * 2 + -1;
    }
    else {
      iVar4 = iVar3 / iVar5;
    }
  }
  *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = iVar4;
  iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  iVar3 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  iVar5 = -0x80000000;
  iVar7 = -0x80000000;
  if (iVar3 != -1 || iVar4 != -0x80000000) {
    if (iVar3 == 0) {
      iVar7 = (uint)(iVar4 < 0) * 2 + -1;
    }
    else {
      iVar7 = iVar4 / iVar3;
    }
  }
  *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = iVar7;
  iVar4 = *(int *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  iVar3 = *(int *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  if (iVar3 != -1 || iVar4 != -0x80000000) {
    if (iVar3 == 0) {
      iVar5 = (uint)(iVar4 < 0) * 2 + -1;
    }
    else {
      iVar5 = iVar4 / iVar3;
    }
  }
  *(int *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = iVar5;
  return;
}

Assistant:

void helper_msa_div_s_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_div_s_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_div_s_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_div_s_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_div_s_df(DF_WORD, pws->w[3],  pwt->w[3]);
}